

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpgen.cpp
# Opt level: O0

void __thiscall
cp::cpgen::getWalkingPattern
          (cpgen *this,Vector3 *com_pos,Quat *waist_r,Pose *right_leg_pose,Pose *left_leg_pose)

{
  int iVar1;
  DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *pDVar2;
  Scalar *pSVar3;
  Scalar *y;
  Quat *ref_waist;
  ostream *this_00;
  Pose *local_d8;
  Quat local_98;
  Vector3 local_70;
  Matrix<double,_2,_1,_0,_2,_1> local_58 [2];
  Pose *local_30;
  Pose *left_leg_pose_local;
  Pose *right_leg_pose_local;
  Quat *waist_r_local;
  Vector3 *com_pos_local;
  cpgen *this_local;
  
  local_30 = left_leg_pose;
  left_leg_pose_local = right_leg_pose;
  right_leg_pose_local = (Pose *)waist_r;
  waist_r_local = (Quat *)com_pos;
  com_pos_local = (Vector3 *)this;
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::step_delta_time == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::step_delta_time), iVar1 != 0)) {
    getWalkingPattern::step_delta_time = *(double *)(this + 0x860) + *(double *)(this + 0x858) + 1.0
    ;
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::step_delta_time);
  }
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::end_cp == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::end_cp), iVar1 != 0)) {
    pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             Pose::p((Pose *)(this + 0xae0));
    pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::x(pDVar2);
    pDVar2 = (DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
             Pose::p((Pose *)(this + 0xae0));
    y = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::y(pDVar2);
    Eigen::Matrix<double,2,1,0,2,1>::Matrix<double,double>
              ((Matrix<double,2,1,0,2,1> *)&getWalkingPattern::end_cp,pSVar3,y);
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::end_cp);
  }
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::ref_waist_pose == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::ref_waist_pose), iVar1 != 0)) {
    Pose::Pose(&getWalkingPattern::ref_waist_pose,(Pose *)(this + 0xae0));
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::ref_waist_pose);
  }
  if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
       ::ref_land_pose == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                   ::ref_land_pose), iVar1 != 0)) {
    Pose::Pose(getWalkingPattern::ref_land_pose,(Pose *)(this + 0x920));
    Pose::Pose(getWalkingPattern::ref_land_pose + 1,(Pose *)(this + 0xa00));
    __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                         ::ref_land_pose);
  }
  if (*(int *)(this + 0x8dc) != 0) {
    if (*(double *)(this + 0x860) + *(double *)(this + 0x858) <= getWalkingPattern::step_delta_time)
    {
      pSVar3 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::z
                         ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)(this + 0x8c0)
                         );
      calcNextFootprint(this,(Vector3 *)(this + 0x8c0),*pSVar3,&getWalkingPattern::ref_waist_pose,
                        getWalkingPattern::ref_land_pose);
      calcEndCP((cpgen *)local_58,(Pose *)this);
      Eigen::Matrix<double,_2,_1,_0,_2,_1>::operator=(&getWalkingPattern::end_cp,local_58);
      CoMTrack::calcRefZMP((CoMTrack *)this,&getWalkingPattern::end_cp);
      ref_waist = Pose::q(&getWalkingPattern::ref_waist_pose);
      LegTrack::setStepVar
                ((LegTrack *)(this + 0x80),getWalkingPattern::ref_land_pose,ref_waist,
                 *(rl *)(this + 0x8d8),*(walking_state *)(this + 0x8dc));
      getWalkingPattern::step_delta_time = 0.0;
    }
    if ((getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
         ::leg_pose == '\0') &&
       (iVar1 = __cxa_guard_acquire(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                                     ::leg_pose), iVar1 != 0)) {
      local_d8 = getWalkingPattern::leg_pose;
      do {
        Pose::Pose(local_d8);
        local_d8 = local_d8 + 1;
      } while (local_d8 !=
               (Pose *)&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                        ::leg_pose);
      __cxa_guard_release(&getWalkingPattern(Eigen::Matrix<double,int,int,int,int,int>*,Eigen::Quaternion<double,int>*,cp::Pose*,cp::Pose*)
                           ::leg_pose);
    }
    CoMTrack::getCoMTrack
              (&local_70,(CoMTrack *)this,&getWalkingPattern::end_cp,
               getWalkingPattern::step_delta_time);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)waist_r_local,&local_70);
    LegTrack::getLegTrack
              ((LegTrack *)(this + 0x80),getWalkingPattern::step_delta_time,
               getWalkingPattern::leg_pose);
    LegTrack::getWaistTrack(&local_98,(LegTrack *)(this + 0x80),getWalkingPattern::step_delta_time);
    Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)right_leg_pose_local,&local_98)
    ;
    Pose::operator=(left_leg_pose_local,getWalkingPattern::leg_pose);
    Pose::operator=(local_30,getWalkingPattern::leg_pose + 1);
    getWalkingPattern::step_delta_time =
         *(double *)(this + 0x850) + getWalkingPattern::step_delta_time;
    if (*(double *)(this + 0x860) + *(double *)(this + 0x858) <= getWalkingPattern::step_delta_time)
    {
      *(uint *)(this + 0x8d8) = (uint)(*(int *)(this + 0x8d8) == 0);
      if (*(int *)(this + 0x8dc) == 6) {
        *(undefined4 *)(this + 0x8dc) = 7;
      }
      else if (*(int *)(this + 0x8dc) == 7) {
        *(undefined4 *)(this + 0x8dc) = 1;
      }
      else if (*(int *)(this + 0x8dc) == 5) {
        *(undefined4 *)(this + 0x8dc) = 3;
      }
      else if (*(int *)(this + 0x8dc) == 3) {
        *(undefined4 *)(this + 0x8dc) = 4;
      }
      else if (*(int *)(this + 0x8dc) == 4) {
        *(undefined4 *)(this + 0x8dc) = 0;
        this_00 = std::operator<<((ostream *)&std::cout,"[cpgen] Stopped");
        std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      }
      else if (*(int *)(this + 0x8dc) == 8) {
        *(undefined4 *)(this + 0x8dc) = 2;
      }
      else if (*(int *)(this + 0x8dc) == 9) {
        *(undefined4 *)(this + 0x8dc) = 1;
      }
    }
  }
  return;
}

Assistant:

void cpgen::getWalkingPattern(Vector3* com_pos, Quat* waist_r,
                              Pose* right_leg_pose, Pose* left_leg_pose) {

  static double step_delta_time = double_sup_time + single_sup_time + 1.0;
  static Vector2 end_cp(init_waist_pose.p().x(), init_waist_pose.p().y());
  static Pose ref_waist_pose = init_waist_pose;
  static Pose ref_land_pose[2] = {init_feet_pose[0], init_feet_pose[1]};

  if (wstate == stopped) return;

  // if finished a step, calc leg track and reference ZMP.
  if (step_delta_time >= double_sup_time + single_sup_time) {
    // to calc legtrack
    calcNextFootprint(land_pos, land_pos.z(),
                      ref_waist_pose, ref_land_pose);
    end_cp = calcEndCP(ref_land_pose);
    comtrack.calcRefZMP(end_cp);
    legtrack.setStepVar(ref_land_pose, ref_waist_pose.q(), swingleg, wstate);
    step_delta_time = 0.0;
  }

  // push walking pattern
  static Pose leg_pose[2];
  *com_pos = comtrack.getCoMTrack(end_cp, step_delta_time);
  legtrack.getLegTrack(step_delta_time, leg_pose);
  *waist_r = legtrack.getWaistTrack(step_delta_time);
  *right_leg_pose = leg_pose[0];
  *left_leg_pose  = leg_pose[1];

  // setting flag and time if finished a step
  step_delta_time += dt;
  if (step_delta_time >= double_sup_time + single_sup_time) {
    swingleg = swingleg == right ? left : right;
    if (wstate == starting1) {
      wstate = starting2;
    } else if (wstate == starting2) {
      // if (whichwalk == step) {
      //   wstate = step;
      // } else {
      //   wstate = walk;
      // }
      wstate = walk;
    } else if (wstate == stop_next) {
      wstate = stopping1;
    } else if (wstate == stopping1) {
      wstate = stopping2;
    } else if (wstate == stopping2) {
      wstate = stopped;
      std::cout << "[cpgen] Stopped" << std::endl;
    } else if (wstate == walk2step) {
      wstate = step;
    } else if (wstate == step2walk) {
      wstate = walk;
    }
  }
}